

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O1

int Llb_ManComputeBestAttr(Llb_Mtr_t *p)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  uint local_54;
  float local_50;
  
  local_54 = 0xffffffff;
  if (2 < p->nCols) {
    uVar6 = p->nCols - 1;
    local_50 = -100000.0;
    local_54 = 0xffffffff;
    uVar8 = 2;
    uVar7 = 1;
    do {
      uVar1 = uVar7 + 1;
      if ((long)uVar1 < (long)(int)uVar6) {
        piVar5 = p->pColSums;
        iVar2 = piVar5[uVar7];
        uVar9 = uVar8;
        do {
          if ((((iVar2 != 0) && (iVar3 = p->pMan->pPars->nClusterMax, iVar2 <= iVar3)) &&
              (iVar4 = piVar5[uVar9], iVar4 != 0)) && (iVar4 <= iVar3)) {
            fVar10 = Llb_ManComputeCommonAttr(p,(int)uVar7,(uint)uVar9);
            if (local_50 < fVar10) {
              local_54 = (int)uVar7 << 0x10 | (uint)uVar9;
              local_50 = fVar10;
            }
          }
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
      }
      uVar8 = uVar8 + 1;
      uVar7 = uVar1;
    } while (uVar1 != uVar6);
  }
  return local_54;
}

Assistant:

int Llb_ManComputeBestAttr( Llb_Mtr_t * p )
{
    float WeightBest = -100000, WeightCur;
    int i, k, RetValue = -1;
    for ( i = 1; i < p->nCols-1; i++ )
    for ( k = i+1; k < p->nCols-1; k++ )
    {
        if ( p->pColSums[i] == 0 || p->pColSums[i] > p->pMan->pPars->nClusterMax )
            continue;
        if ( p->pColSums[k] == 0 || p->pColSums[k] > p->pMan->pPars->nClusterMax )
            continue;
        WeightCur = Llb_ManComputeCommonAttr( p, i, k );
        if ( WeightBest < WeightCur )
        {
            WeightBest = WeightCur;
            RetValue   = (i << 16) | k;
        }
    }
    return RetValue;
}